

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O2

void __thiscall benchmark::CSVReporter::PrintRunData(CSVReporter *this,Run *run)

{
  ostream *poVar1;
  ostream *poVar2;
  BigO complexity;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  allocator local_92;
  allocator local_91;
  string msg;
  string local_70;
  string local_50;
  string name;
  
  poVar2 = (this->super_BenchmarkReporter).output_stream_;
  std::__cxx11::string::string((string *)&name,(string *)run);
  std::__cxx11::string::string((string *)&msg,"\"",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"\"\"",&local_92);
  ReplaceAll(&name,&msg,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&msg);
  poVar1 = std::operator<<(poVar2,'\"');
  poVar1 = std::operator<<(poVar1,(string *)&name);
  std::operator<<(poVar1,"\",");
  if (run->error_occurred == true) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&msg,
               (char)(DAT_0014ba50 - (anonymous_namespace)::elements_abi_cxx11_ >> 5) + -3);
    std::operator<<(poVar2,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::operator<<(poVar2,"true,");
    std::__cxx11::string::string((string *)&msg,(string *)&run->error_message);
    std::__cxx11::string::string((string *)&local_70,"\"",&local_92);
    std::__cxx11::string::string((string *)&local_50,"\"\"",&local_91);
    ReplaceAll(&msg,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,(string *)&msg);
    std::operator<<(poVar2,"\"\n");
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    if ((run->report_big_o == false) && (run->report_rms == false)) {
      std::ostream::_M_insert<long>((long)poVar2);
    }
    std::operator<<(poVar2,",");
    dVar5 = BenchmarkReporter::Run::GetAdjustedRealTime(run);
    poVar1 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar1,",");
    dVar5 = BenchmarkReporter::Run::GetAdjustedCPUTime(run);
    poVar1 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar1,",");
    if (run->report_big_o == true) {
      GetBigOString_abi_cxx11_(&msg,(benchmark *)(ulong)run->complexity,complexity);
      std::operator<<(poVar2,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
    else if (run->report_rms == false) {
      pcVar3 = "ns";
      if (run->time_unit == kMicrosecond) {
        pcVar3 = "us";
      }
      pcVar4 = "ms";
      if (run->time_unit != kMillisecond) {
        pcVar4 = pcVar3;
      }
      std::operator<<(poVar2,pcVar4);
    }
    std::operator<<(poVar2,",");
    if (0.0 < run->bytes_per_second) {
      std::ostream::_M_insert<double>(run->bytes_per_second);
    }
    std::operator<<(poVar2,",");
    if (0.0 < run->items_per_second) {
      std::ostream::_M_insert<double>(run->items_per_second);
    }
    std::operator<<(poVar2,",");
    if ((run->report_label)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&msg,(string *)&run->report_label);
      std::__cxx11::string::string((string *)&local_70,"\"",&local_92);
      std::__cxx11::string::string((string *)&local_50,"\"\"",&local_91);
      ReplaceAll(&msg,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      poVar1 = std::operator<<(poVar2,"\"");
      poVar1 = std::operator<<(poVar1,(string *)&msg);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string((string *)&msg);
    }
    std::operator<<(poVar2,",,");
    std::operator<<(poVar2,'\n');
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CSVReporter::PrintRunData(const Run & run) {
  std::ostream& Out = GetOutputStream();

  // Field with embedded double-quote characters must be doubled and the field
  // delimited with double-quotes.
  std::string name = run.benchmark_name;
  ReplaceAll(&name, "\"", "\"\"");
  Out << '"' << name << "\",";
  if (run.error_occurred) {
    Out << std::string(elements.size() - 3, ',');
    Out << "true,";
    std::string msg = run.error_message;
    ReplaceAll(&msg, "\"", "\"\"");
    Out << '"' << msg << "\"\n";
    return;
  }

  // Do not print iteration on bigO and RMS report
  if (!run.report_big_o && !run.report_rms) {
    Out << run.iterations;
  }
  Out << ",";

  Out << run.GetAdjustedRealTime() << ",";
  Out << run.GetAdjustedCPUTime() << ",";

  // Do not print timeLabel on bigO and RMS report
  if (run.report_big_o) {
    Out << GetBigOString(run.complexity);
  } else if (!run.report_rms) {
    Out << GetTimeUnitString(run.time_unit);
  }
  Out << ",";

  if (run.bytes_per_second > 0.0) {
    Out << run.bytes_per_second;
  }
  Out << ",";
  if (run.items_per_second > 0.0) {
    Out << run.items_per_second;
  }
  Out << ",";
  if (!run.report_label.empty()) {
    // Field with embedded double-quote characters must be doubled and the field
    // delimited with double-quotes.
    std::string label = run.report_label;
    ReplaceAll(&label, "\"", "\"\"");
    Out << "\"" << label << "\"";
  }
  Out << ",,";  // for error_occurred and error_message
  Out << '\n';
}